

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

void __thiscall mat_lib::vector<double>::vector(vector<double> *this,string *file_name)

{
  int iVar1;
  char *__nptr;
  iterator __position;
  char *pcVar2;
  _Alloc_hider __nptr_00;
  vector<double> *pvVar3;
  long *__s;
  bool bVar4;
  size_t sVar5;
  int *piVar6;
  long lVar7;
  ostream *poVar8;
  logic_error *plVar9;
  ulong uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  numbers;
  regex rx;
  cmatch results;
  string str;
  ifstream ifs;
  string_type local_468;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  vector<double,_std::allocator<double>_> *local_430;
  vector<double> *local_428;
  anon_union_16_2_ba345be5_for_m_Storage local_420;
  ulong local_410;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_408;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_3e8;
  iterator_range<const_char_*> local_3c0;
  long *local_3b0 [2];
  long local_3a0 [45];
  long local_238 [4];
  byte abStack_218 [200];
  undefined8 auStack_150 [36];
  
  local_430 = &this->container__;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->format__ = fixed;
  this->fractional_digits__ = 6;
  local_428 = this;
  std::ifstream::ifstream(local_238,(string *)file_name,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
LAB_00153eba:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"cannot open file \"",0x12);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3b0,(file_name->_M_dataplus)._M_p,
                        file_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"! (",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vector",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"() in ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x3a6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::logic_error::logic_error(plVar9,(string *)&local_408);
    __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)local_3b0,
             *(undefined8 *)((long)auStack_150 + *(long *)(local_238[0] + -0x18)),0xffffffff,0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_408,
             "mat_lib::vector\\[(\\d)\\]\\{(([-+]?\\d*\\.?\\d+([eE][-+]?\\d+)?(,\\s|\\n\\s*)?)+)+\\}"
             ,0x10);
  __s = local_3b0[0];
  local_3e8.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e8._M_begin = (char *)0x0;
  local_3e8.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar5 = strlen((char *)local_3b0[0]);
  bVar4 = std::__detail::
          __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    ((char *)__s,(char *)((long)__s + sVar5),&local_3e8,&local_408,0);
  if (!bVar4) {
    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar9,"the file are incorrect: bad expresion");
    __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::str(&local_468,&local_3e8,1);
  __nptr_00._M_p = local_468._M_dataplus._M_p;
  piVar6 = __errno_location();
  iVar1 = *piVar6;
  *piVar6 = 0;
  lVar7 = strtol(__nptr_00._M_p,(char **)&local_448,10);
  if (local_448.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)__nptr_00._M_p) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar7 == lVar7) && (*piVar6 != 0x22)) {
    if (*piVar6 == 0) {
      *piVar6 = iVar1;
    }
    this->max_size__ = (long)(int)lVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
    local_448.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_448.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_448.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::str
              (&local_468,&local_3e8,2);
    local_3c0.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
    .super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
    super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin =
         "(,|\n)";
    local_3c0.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
    .super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
    super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
         "";
    boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
              ((is_any_ofF<char> *)&local_420,&local_3c0);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
              (&local_448,&local_468,(is_any_ofF<char> *)&local_420,token_compress_off);
    if ((0x10 < local_410) && (local_420.m_dynSet != (set_value_type *)0x0)) {
      operator_delete__(local_420.m_dynSet);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
    if ((long)local_448.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_448.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5 == this->max_size__) {
      if (this->max_size__ != 0) {
        lVar7 = 0;
        uVar10 = 0;
        do {
          __nptr = *(char **)((long)&((local_448.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar7);
          iVar1 = *piVar6;
          *piVar6 = 0;
          pcVar2 = (char *)strtod(__nptr,(char **)&local_468);
          pvVar3 = local_428;
          if (local_468._M_dataplus._M_p == __nptr) {
            std::__throw_invalid_argument("stod");
LAB_00153eae:
            std::__throw_out_of_range("stod");
            file_name = &local_468;
            goto LAB_00153eba;
          }
          if (*piVar6 == 0) {
            *piVar6 = iVar1;
          }
          else if (*piVar6 == 0x22) goto LAB_00153eae;
          __position._M_current =
               (local_428->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_3c0.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin = pcVar2;
          if (__position._M_current ==
              (local_428->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (local_430,__position,(double *)&local_3c0);
          }
          else {
            *__position._M_current = (double)pcVar2;
            (local_428->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          uVar10 = uVar10 + 1;
          lVar7 = lVar7 + 0x20;
        } while (uVar10 < pvVar3->max_size__);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_448);
      if (local_3e8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3e8.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_3e8.
                              super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3e8.
                              super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_408);
      if (local_3b0[0] != local_3a0) {
        operator_delete(local_3b0[0],local_3a0[0] + 1);
      }
      std::ifstream::~ifstream(local_238);
      return;
    }
    goto LAB_00154011;
  }
  std::__throw_out_of_range("stoi");
LAB_00154011:
  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar9,"the file are incorrect: bad declaration of matrix");
  __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

vector<T>::vector(const string &file_name) {
        ifstream ifs(file_name);
        if(!ifs)
        {
            ostringstream str_stream;
            str_stream<<"cannot open file \""<<file_name<<"\"! ("
                      <<__func__<<"() in "<<__FILE__<<":"<<__LINE__<<")";
            throw logic_error(str_stream.str());
        }

        string str((istreambuf_iterator<char>(ifs)),
                   istreambuf_iterator<char>());

        regex rx(R"(mat_lib::vector\[(\d)\]\{(([-+]?\d*\.?\d+([eE][-+]?\d+)?(,\s|\n\s*)?)+)+\})");
        cmatch results;
        if (not regex_match(str.c_str(),results,rx)) {
            throw logic_error("the file are incorrect: bad expresion");
        }

        max_size__ = stoi(results.str(1));
        std::vector<string> numbers;
        boost::split(numbers, results.str(2), boost::is_any_of("(,|\n)"));


        if (numbers.size() != max_size__) {
            throw logic_error("the file are incorrect: bad declaration of matrix");
        }

        for(size_t i=0; i<max_size__; i++) {
            container__.push_back(stod(numbers[i]));
        }

    }